

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall leveldb::VersionEdit::VersionEdit(VersionEdit *this)

{
  VersionEdit *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ::vector(&this->compact_pointers_);
  std::
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::set(&this->deleted_files_);
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::vector(&this->new_files_);
  Clear(this);
  return;
}

Assistant:

VersionEdit() { Clear(); }